

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

void __thiscall
Refal2::CSetBuilder<unsigned_int>::Exclude(CSetBuilder<unsigned_int> *this,uint *element)

{
  undefined1 local_48 [8];
  CSet tmp;
  uint *element_local;
  CSetBuilder<unsigned_int> *this_local;
  
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)element;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_48);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_48,
             (value_type *)tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Exclude(this,(CSet *)local_48);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void CSetBuilder<T>::Exclude( const T& element )
{
	CSet tmp;
	tmp.insert( element );
	Exclude( tmp );
}